

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# program_options.cpp
# Opt level: O1

size_t __thiscall
Potassco::ProgramOptions::DefaultFormat::format
          (DefaultFormat *this,vector<char,_std::allocator<char>_> *buffer,OptionGroup *grp)

{
  pointer pcVar1;
  size_type sVar2;
  pointer pcVar3;
  char local_1c [4];
  
  pcVar1 = (buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data
           ._M_start;
  if ((buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
      _M_finish != pcVar1) {
    (buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
    _M_finish = pcVar1;
  }
  sVar2 = (grp->caption_)._M_string_length;
  if (sVar2 != 0) {
    std::vector<char,_std::allocator<char>_>::reserve(buffer,sVar2 + 4);
    local_1c[3] = 10;
    std::vector<char,_std::allocator<char>_>::emplace_back<char>(buffer,local_1c + 3);
    pcVar3 = (grp->caption_)._M_dataplus._M_p;
    std::vector<char,std::allocator<char>>::
    _M_range_insert<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
              ((vector<char,std::allocator<char>> *)buffer,
               (buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
               super__Vector_impl_data._M_finish,pcVar3,pcVar3 + (grp->caption_)._M_string_length);
    local_1c[2] = 0x3a;
    std::vector<char,_std::allocator<char>_>::emplace_back<char>(buffer,local_1c + 2);
    local_1c[1] = 10;
    std::vector<char,_std::allocator<char>_>::emplace_back<char>(buffer,local_1c + 1);
    local_1c[0] = '\n';
    std::vector<char,_std::allocator<char>_>::emplace_back<char>(buffer,local_1c);
  }
  return (long)(buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
               super__Vector_impl_data._M_finish -
         (long)(buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
               super__Vector_impl_data._M_start;
}

Assistant:

std::size_t DefaultFormat::format(std::vector<char>& buffer, const OptionGroup& grp) {
	buffer.clear();
	if (grp.caption().length()) {
		buffer.reserve(grp.caption().length() + 4);
		buffer.push_back('\n');
		buffer.insert(buffer.end(), grp.caption().begin(), grp.caption().end());
		buffer.push_back(':');
		buffer.push_back('\n');
		buffer.push_back('\n');
	}
	return buffer.size();
}